

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O3

void __thiscall
TransactionApi_EstimateFee_TaprootSchnorr_Test::~TransactionApi_EstimateFee_TaprootSchnorr_Test
          (TransactionApi_EstimateFee_TaprootSchnorr_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TransactionApi, EstimateFee_TaprootSchnorr) {
  std::string tx_hex = "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000";
  AddressFactory factory(NetType::kRegtest);
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916");
  utxo1.vout = 0;
  utxo1.locking_script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddressByLockingScript(utxo1.locking_script);
  utxo1.descriptor = "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)";
  utxo1.amount = Amount(int64_t{2499999000});
  utxo1.address_type = AddressType::kTaprootAddress;

  TransactionContext txc(tx_hex);
  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 2.0;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  TransactionApi api;
  calc_fee = api.EstimateFee(
      txc.GetHex(), utxos, &tx_fee, &utxo_fee, effective_fee_rate);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 101*2);  // upper
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 43*2);  // upper
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 58*2);
}